

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int io_lines(lua_State *L)

{
  int iVar1;
  char *__filename;
  lua_State *L_00;
  GCObject *pGVar2;
  lua_State *in_RDI;
  lua_State *unaff_retaddr;
  FILE **pf;
  char *filename;
  lua_State *in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  int narg;
  int in_stack_fffffffffffffffc;
  
  iVar1 = lua_type(in_RDI,(int)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  narg = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  if (iVar1 < 1) {
    lua_rawgeti(in_RDI,narg,(int)in_stack_ffffffffffffffe8);
    iVar1 = f_lines((lua_State *)0x11d2cb);
  }
  else {
    __filename = luaL_checklstring(in_RDI,narg,(size_t *)in_stack_ffffffffffffffe0);
    L_00 = (lua_State *)newfile(in_stack_ffffffffffffffe0);
    pGVar2 = (GCObject *)fopen64(__filename,"r");
    L_00->next = pGVar2;
    if (L_00->next == (GCObject *)0x0) {
      fileerror(unaff_retaddr,in_stack_fffffffffffffffc,(char *)in_RDI);
    }
    lua_gettop(in_RDI);
    aux_lines(L_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int io_lines(lua_State*L){
if(lua_isnoneornil(L,1)){
lua_rawgeti(L,(-10001),1);
return f_lines(L);
}
else{
const char*filename=luaL_checkstring(L,1);
FILE**pf=newfile(L);
*pf=fopen(filename,"r");
if(*pf==NULL)
fileerror(L,1,filename);
aux_lines(L,lua_gettop(L),1);
return 1;
}
}